

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::BufferGLImpl::Unmap(BufferGLImpl *this,GLContextState *CtxState)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  GLboolean Result;
  bool ResetVAO;
  GLContextState *CtxState_local;
  BufferGLImpl *this_local;
  
  msg.field_2._M_local_buf[0xf] = '\x01';
  GLContextState::BindBuffer(CtxState,this->m_BindTarget,&this->m_GlBuffer,true);
  msg.field_2._M_local_buf[0xe] = (*__glewUnmapBuffer)(this->m_BindTarget);
  if (msg.field_2._M_local_buf[0xe] == '\0') {
    FormatString<char[57]>
              ((string *)local_40,
               (char (*) [57])"Failed to unmap buffer. The data may have been corrupted");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Unmap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x187);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void BufferGLImpl::Unmap(GLContextState& CtxState)
{
    constexpr bool ResetVAO = true;
    CtxState.BindBuffer(m_BindTarget, m_GlBuffer, ResetVAO);
    auto Result = glUnmapBuffer(m_BindTarget);
    // glUnmapBuffer() returns TRUE unless data values in the buffer's data store have
    // become corrupted during the period that the buffer was mapped. Such corruption
    // can be the result of a screen resolution change or other window system - dependent
    // event that causes system heaps such as those for high - performance graphics memory
    // to be discarded. GL implementations must guarantee that such corruption can
    // occur only during the periods that a buffer's data store is mapped. If such corruption
    // has occurred, glUnmapBuffer() returns FALSE, and the contents of the buffer's
    // data store become undefined.
    VERIFY(Result != GL_FALSE, "Failed to unmap buffer. The data may have been corrupted");
    (void)Result;
}